

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_reaper.cc
# Opt level: O2

void __thiscall sptk::reaper::FFT::ifft(FFT *this,float *x,float *y)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  float *pfVar6;
  float *pfVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  float fVar19;
  
  iVar10 = this->power2;
  iVar9 = this->kbase;
  uVar5 = this->fftSize;
  iVar11 = 0;
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  uVar14 = uVar5;
  for (; iVar11 != iVar10; iVar11 = iVar11 + 1) {
    uVar8 = (int)uVar14 / 2;
    pfVar6 = this->fsine;
    pfVar7 = this->fcosine;
    lVar16 = (long)(int)uVar8;
    uVar12 = 0;
    if (0 < (int)uVar8) {
      uVar12 = (ulong)uVar8;
    }
    lVar15 = 0;
    for (uVar18 = 0; uVar18 != uVar12; uVar18 = uVar18 + 1) {
      fVar1 = pfVar7[lVar15];
      fVar2 = pfVar6[lVar15];
      lVar17 = lVar16;
      for (uVar13 = uVar18; (long)uVar13 <= (long)(uVar18 + (long)(int)(uVar5 - uVar14));
          uVar13 = uVar13 + (long)(int)uVar14) {
        fVar19 = x[uVar13] - x[lVar17];
        fVar3 = y[uVar13];
        fVar4 = y[lVar17];
        x[uVar13] = x[uVar13] + x[lVar17];
        y[uVar13] = y[lVar17] + y[uVar13];
        x[lVar17] = fVar1 * fVar19 + (fVar3 - fVar4) * -fVar2;
        y[lVar17] = fVar19 * fVar2 + fVar1 * (fVar3 - fVar4);
        lVar17 = lVar17 + (int)uVar14;
      }
      lVar15 = lVar15 + iVar9;
      lVar16 = lVar16 + 1;
    }
    iVar9 = iVar9 * 2;
    uVar14 = uVar8;
  }
  iVar10 = 1;
  for (lVar16 = 1; lVar16 < (int)uVar5; lVar16 = lVar16 + 1) {
    lVar15 = (long)iVar10;
    if (lVar15 < lVar16) {
      fVar1 = x[lVar15 + -1];
      fVar2 = y[lVar15 + -1];
      x[lVar15 + -1] = x[lVar16 + -1];
      y[lVar15 + -1] = y[lVar16 + -1];
      x[lVar16 + -1] = fVar1;
      y[lVar16 + -1] = fVar2;
    }
    uVar12 = (ulong)uVar5;
    do {
      iVar11 = iVar10;
      uVar18 = (long)(int)uVar12 / 2;
      uVar12 = uVar18 & 0xffffffff;
      iVar9 = (int)uVar18;
      iVar10 = iVar11 - iVar9;
    } while (iVar11 - iVar9 != 0 && iVar9 <= iVar11);
    iVar10 = iVar9 + iVar11;
  }
  return;
}

Assistant:

void FFT::ifft(float *x, float *y) {
  float c, s,  t1, t2;
  int j1, j2, li, lix, i;
  int lmx, lo, lixnp, lm, j, nv2, k = kbase, im, jm, l = power2;

  for (lmx = fftSize, lo = 0; lo < l; lo++, k *= 2) {
    lix = lmx;
    lmx /= 2;
    lixnp = fftSize - lix;
    for (i = 0, lm = 0; lm < lmx; lm++, i += k) {
      c = fcosine[i];
      s = -fsine[i];
      for (li = lixnp + lm, j1 = lm, j2 = lm + lmx; j1 <= li;
            j1 += lix, j2 += lix) {
        t1 = x[j1] - x[j2];
        t2 = y[j1] - y[j2];
        x[j1] += x[j2];
        y[j1] += y[j2];
        x[j2] = (c * t1) + (s * t2);
        y[j2] = (c * t2) - (s * t1);
      }
    }
  }

  /* Now perform the bit reversal. */
  j = 1;
  nv2 = fftSize / 2;
  for (i = 1; i < fftSize; i++) {
    if (j < i) {
      jm = j-1;
      im = i-1;
      t1 = x[jm];
      t2 = y[jm];
      x[jm] = x[im];
      y[jm] = y[im];
      x[im] = t1;
      y[im] = t2;
    }
    k = nv2;
    while (j > k) {
      j -= k;
      k /= 2;
    }
    j += k;
  }
}